

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

void sysbvm_type_buildSlotDictionary(sysbvm_context_t *context,sysbvm_tuple_t type)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  
  if ((((type & 0xf) == 0 && type != 0) &&
      (uVar4 = *(ulong *)(type + 0x38), (uVar4 & 0xf) == 0 && uVar4 != 0)) &&
     (7 < *(uint *)(uVar4 + 0xc))) {
    uVar4 = (ulong)(*(uint *)(uVar4 + 0xc) >> 3);
    if (*(long *)(type + 0x80) == 0) {
      sVar2 = sysbvm_methodDictionary_createWithCapacity(context,uVar4);
      *(sysbvm_tuple_t *)(type + 0x80) = sVar2;
    }
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = *(ulong *)(type + 0x38);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar3 * 8);
      }
      else {
        sVar2 = 0;
      }
      if (*(sysbvm_tuple_t *)(sVar2 + 0x10) != 0) {
        sysbvm_methodDictionary_atPut
                  (context,*(sysbvm_tuple_t *)(type + 0x80),*(sysbvm_tuple_t *)(sVar2 + 0x10),sVar2)
        ;
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_type_buildSlotDictionary(sysbvm_context_t *context, sysbvm_tuple_t type)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return;

    sysbvm_type_tuple_t* typeObject = (sysbvm_type_tuple_t*)type;
    size_t slotCount = sysbvm_array_getSize(typeObject->slots);
    if(slotCount == 0) return;

    if(!typeObject->slotDictionary)
        typeObject->slotDictionary = sysbvm_methodDictionary_createWithCapacity(context, slotCount);

    for(size_t i = 0; i < slotCount; ++i)
    {
        sysbvm_typeSlot_t *typeSlot = (sysbvm_typeSlot_t*)sysbvm_array_at(typeObject->slots, i);
        if(typeSlot->super.name)
            sysbvm_methodDictionary_atPut(context, typeObject->slotDictionary, typeSlot->super.name, (sysbvm_tuple_t)typeSlot);
    }
}